

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_tweak_mul(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *tweak32)

{
  int extraout_EAX;
  int iVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int overflow;
  secp256k1_scalar factor;
  secp256k1_ge p;
  int local_124;
  secp256k1_scalar local_120;
  secp256k1_ge local_100;
  undefined1 local_a8 [104];
  undefined1 local_40 [16];
  int local_30;
  
  local_124 = 0;
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ec_pubkey_tweak_mul_cold_2();
  }
  else {
    if (tweak32 != (uchar *)0x0) {
      secp256k1_scalar_set_b32(&local_120,tweak32,&local_124);
      if (local_124 == 0) {
        iVar1 = secp256k1_pubkey_load(ctx,&local_100,pubkey);
        bVar2 = iVar1 != 0;
      }
      else {
        bVar2 = false;
        iVar1 = extraout_EAX;
      }
      pubkey->data[0x30] = '\0';
      pubkey->data[0x31] = '\0';
      pubkey->data[0x32] = '\0';
      pubkey->data[0x33] = '\0';
      pubkey->data[0x34] = '\0';
      pubkey->data[0x35] = '\0';
      pubkey->data[0x36] = '\0';
      pubkey->data[0x37] = '\0';
      pubkey->data[0x38] = '\0';
      pubkey->data[0x39] = '\0';
      pubkey->data[0x3a] = '\0';
      pubkey->data[0x3b] = '\0';
      pubkey->data[0x3c] = '\0';
      pubkey->data[0x3d] = '\0';
      pubkey->data[0x3e] = '\0';
      pubkey->data[0x3f] = '\0';
      pubkey->data[0x20] = '\0';
      pubkey->data[0x21] = '\0';
      pubkey->data[0x22] = '\0';
      pubkey->data[0x23] = '\0';
      pubkey->data[0x24] = '\0';
      pubkey->data[0x25] = '\0';
      pubkey->data[0x26] = '\0';
      pubkey->data[0x27] = '\0';
      pubkey->data[0x28] = '\0';
      pubkey->data[0x29] = '\0';
      pubkey->data[0x2a] = '\0';
      pubkey->data[0x2b] = '\0';
      pubkey->data[0x2c] = '\0';
      pubkey->data[0x2d] = '\0';
      pubkey->data[0x2e] = '\0';
      pubkey->data[0x2f] = '\0';
      pubkey->data[0x10] = '\0';
      pubkey->data[0x11] = '\0';
      pubkey->data[0x12] = '\0';
      pubkey->data[0x13] = '\0';
      pubkey->data[0x14] = '\0';
      pubkey->data[0x15] = '\0';
      pubkey->data[0x16] = '\0';
      pubkey->data[0x17] = '\0';
      pubkey->data[0x18] = '\0';
      pubkey->data[0x19] = '\0';
      pubkey->data[0x1a] = '\0';
      pubkey->data[0x1b] = '\0';
      pubkey->data[0x1c] = '\0';
      pubkey->data[0x1d] = '\0';
      pubkey->data[0x1e] = '\0';
      pubkey->data[0x1f] = '\0';
      pubkey->data[0] = '\0';
      pubkey->data[1] = '\0';
      pubkey->data[2] = '\0';
      pubkey->data[3] = '\0';
      pubkey->data[4] = '\0';
      pubkey->data[5] = '\0';
      pubkey->data[6] = '\0';
      pubkey->data[7] = '\0';
      pubkey->data[8] = '\0';
      pubkey->data[9] = '\0';
      pubkey->data[10] = '\0';
      pubkey->data[0xb] = '\0';
      pubkey->data[0xc] = '\0';
      pubkey->data[0xd] = '\0';
      pubkey->data[0xe] = '\0';
      pubkey->data[0xf] = '\0';
      if (bVar2 != false) {
        auVar3._0_4_ = -(uint)((int)local_120.d[2] == 0 && (int)local_120.d[0] == 0);
        auVar3._4_4_ = -(uint)(local_120.d[2]._4_4_ == 0 && local_120.d[0]._4_4_ == 0);
        auVar3._8_4_ = -(uint)((int)local_120.d[3] == 0 && (int)local_120.d[1] == 0);
        auVar3._12_4_ = -(uint)(local_120.d[3]._4_4_ == 0 && local_120.d[1]._4_4_ == 0);
        iVar1 = movmskps(iVar1,auVar3);
        if (iVar1 == 0xf) {
          bVar2 = false;
        }
        else {
          local_30 = local_100.infinity;
          local_a8._0_8_ = local_100.x.n[0];
          local_a8._8_8_ = local_100.x.n[1];
          local_a8._16_8_ = local_100.x.n[2];
          local_a8._24_8_ = local_100.x.n[3];
          local_a8._32_8_ = local_100.x.n[4];
          local_a8._40_8_ = local_100.y.n[0];
          local_a8._48_8_ = local_100.y.n[1];
          local_a8._56_8_ = local_100.y.n[2];
          local_a8._64_8_ = local_100.y.n[3];
          local_a8._72_8_ = local_100.y.n[4];
          local_a8._80_8_ = 1;
          local_a8._88_16_ = (undefined1  [16])0x0;
          local_40 = (undefined1  [16])0x0;
          secp256k1_ecmult((secp256k1_gej *)local_a8,(secp256k1_gej *)local_a8,&local_120,
                           &secp256k1_scalar_zero);
          secp256k1_ge_set_gej(&local_100,(secp256k1_gej *)local_a8);
          secp256k1_pubkey_save(pubkey,&local_100);
        }
      }
      return (uint)bVar2;
    }
    secp256k1_ec_pubkey_tweak_mul_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_tweak_mul(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *tweak32) {
    secp256k1_ge p;
    secp256k1_scalar factor;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = !overflow && secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    if (ret) {
        if (secp256k1_eckey_pubkey_tweak_mul(&p, &factor)) {
            secp256k1_pubkey_save(pubkey, &p);
        } else {
            ret = 0;
        }
    }

    return ret;
}